

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_GetTwinAsync
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,
          IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK deviceTwinCallback,void *userContextCallback)

{
  int iVar1;
  IOTHUB_CLIENT_RESULT IVar2;
  LOGGER_LOG p_Var3;
  undefined8 *__ptr;
  LOGGER_LOG l_3;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l_2;
  GET_TWIN_CONTEXT *getTwinCtx;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *userContextCallback_local;
  IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK deviceTwinCallback_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if ((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
     (deviceTwinCallback == (IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK)0x0)) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_GetTwinAsync",0x9bc,1,
                "Invalid argument iothubClientHandle=%p, deviceTwinCallback=%p",iotHubClientHandle,
                deviceTwinCallback);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    iVar1 = (*iotHubClientHandle->IoTHubTransport_Subscribe_DeviceTwin)
                      (iotHubClientHandle->transportHandle);
    if (iVar1 == 0) {
      __ptr = (undefined8 *)malloc(0x10);
      if (__ptr == (undefined8 *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_GetTwinAsync",0x9cc,1,"Failed creating get-twin context");
        }
        l._4_4_ = IOTHUB_CLIENT_ERROR;
      }
      else {
        *__ptr = deviceTwinCallback;
        __ptr[1] = userContextCallback;
        IVar2 = (*iotHubClientHandle->IoTHubTransport_GetTwinAsync)
                          (iotHubClientHandle->deviceHandle,on_get_device_twin_completed,__ptr);
        if (IVar2 == IOTHUB_CLIENT_OK) {
          iotHubClientHandle->complete_twin_update_encountered = true;
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_GetTwinAsync",0x9d8,1,
                      "Failed getting device twin document");
          }
          free(__ptr);
          l._4_4_ = IOTHUB_CLIENT_ERROR;
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_GetTwinAsync",0x9c3,1,
                  "Failure adding device twin data to queue");
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_GetTwinAsync(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK deviceTwinCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL || deviceTwinCallback == NULL)
    {
        LogError("Invalid argument iothubClientHandle=%p, deviceTwinCallback=%p", iotHubClientHandle, deviceTwinCallback);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        if (iotHubClientHandle->IoTHubTransport_Subscribe_DeviceTwin(iotHubClientHandle->transportHandle) != 0)
        {
            LogError("Failure adding device twin data to queue");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            GET_TWIN_CONTEXT* getTwinCtx;

            if ((getTwinCtx = (GET_TWIN_CONTEXT*)malloc(sizeof(GET_TWIN_CONTEXT))) == NULL)
            {
                LogError("Failed creating get-twin context");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

                getTwinCtx->callback = deviceTwinCallback;
                getTwinCtx->context = userContextCallback;

                if (handleData->IoTHubTransport_GetTwinAsync(handleData->deviceHandle, on_get_device_twin_completed, getTwinCtx) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed getting device twin document");
                    free(getTwinCtx);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    handleData->complete_twin_update_encountered = true;
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
    }

    return result;
}